

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# still_picture_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_87afda::StillPicturePresenceTest::SetUp(StillPicturePresenceTest *this)

{
  libaom_test::EncoderTest::InitializeConfig
            (&this->super_EncoderTest,*(TestMode *)&(this->super_EncoderTest).field_0x3dc);
  (this->super_EncoderTest).cfg_.g_timebase.num = 1;
  (this->super_EncoderTest).cfg_.g_timebase.den = 0x1e;
  (this->super_EncoderTest).cfg_.rc_end_usage = AOM_Q;
  (this->super_EncoderTest).cfg_.g_threads = 1;
  (this->super_EncoderTest).cfg_.full_still_picture_hdr = this->enable_full_header_;
  (this->super_EncoderTest).cfg_.g_limit = 1;
  return;
}

Assistant:

void SetUp() override {
    InitializeConfig(encoding_mode_);
    const aom_rational timebase = { 1, 30 };
    cfg_.g_timebase = timebase;
    cfg_.rc_end_usage = AOM_Q;
    cfg_.g_threads = 1;
    cfg_.full_still_picture_hdr = enable_full_header_;
    cfg_.g_limit = 1;
  }